

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-misc.c
# Opt level: O0

wchar_t borg_extract_dir(wchar_t y1,wchar_t x1,wchar_t y2,wchar_t x2)

{
  wchar_t x2_local;
  wchar_t y2_local;
  wchar_t x1_local;
  wchar_t y1_local;
  
  if ((y1 == y2) && (x1 == x2)) {
    x1_local = L'\x05';
  }
  else if (x1 == x2) {
    x1_local = L'\b';
    if (y1 < y2) {
      x1_local = L'\x02';
    }
  }
  else if (y1 == y2) {
    x1_local = L'\x04';
    if (x1 < x2) {
      x1_local = L'\x06';
    }
  }
  else if (y1 < y2) {
    x1_local = L'\x01';
    if (x1 < x2) {
      x1_local = L'\x03';
    }
  }
  else if (y2 < y1) {
    x1_local = L'\a';
    if (x1 < x2) {
      x1_local = L'\t';
    }
  }
  else {
    x1_local = L'\x05';
  }
  return x1_local;
}

Assistant:

int borg_extract_dir(int y1, int x1, int y2, int x2)
{
    /* No movement required */
    if ((y1 == y2) && (x1 == x2))
        return 5;

    /* South or North */
    if (x1 == x2)
        return ((y1 < y2) ? 2 : 8);

    /* East or West */
    if (y1 == y2)
        return ((x1 < x2) ? 6 : 4);

    /* South-east or South-west */
    if (y1 < y2)
        return ((x1 < x2) ? 3 : 1);

    /* North-east or North-west */
    if (y1 > y2)
        return ((x1 < x2) ? 9 : 7);

    /* Paranoia */
    return 5;
}